

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

int mbedtls_ssl_write_finished(mbedtls_ssl_context *ssl)

{
  uchar *puVar1;
  uint8_t uVar2;
  mbedtls_ssl_handshake_params *pmVar3;
  byte bVar4;
  int iVar5;
  int line;
  char *text;
  
  mbedtls_debug_print_msg
            (ssl,2,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
             ,0x1ead,"=> write finished");
  mbedtls_ssl_update_out_pointers(ssl,ssl->transform_negotiate);
  iVar5 = (*ssl->handshake->calc_finished)(ssl,ssl->out_msg + 4,(int)ssl->conf->endpoint);
  if (iVar5 != 0) {
    mbedtls_debug_print_ret
              (ssl,1,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
               ,0x1eb3,"calc_finished",iVar5);
  }
  ssl->out_msglen = 0x10;
  ssl->out_msgtype = 0x16;
  *ssl->out_msg = '\x14';
  if (ssl->handshake->resume == '\0') {
    ssl->state = ssl->state + 1;
  }
  else {
    uVar2 = ssl->conf->endpoint;
    if (uVar2 == '\x01') {
      ssl->state = 10;
    }
    else if (uVar2 == '\0') {
      ssl->state = 0xf;
    }
  }
  mbedtls_debug_print_msg
            (ssl,3,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
             ,0x1ede,"switching to new transform spec for outbound data");
  if (ssl->conf->transport == '\x01') {
    pmVar3 = ssl->handshake;
    pmVar3->alt_transform_out = ssl->transform_out;
    *(undefined8 *)pmVar3->alt_out_ctr = *(undefined8 *)ssl->cur_out_ctr;
    ssl->cur_out_ctr[6] = '\0';
    ssl->cur_out_ctr[7] = '\0';
    ssl->cur_out_ctr[2] = '\0';
    ssl->cur_out_ctr[3] = '\0';
    ssl->cur_out_ctr[4] = '\0';
    ssl->cur_out_ctr[5] = '\0';
    bVar4 = 2;
    while( true ) {
      puVar1 = ssl->cur_out_ctr + (bVar4 - 1);
      *puVar1 = *puVar1 + '\x01';
      if (*puVar1 != '\0') break;
      bVar4 = bVar4 - 1;
      if (bVar4 == 0) {
        mbedtls_debug_print_msg
                  (ssl,1,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                   ,0x1ef6,"DTLS epoch would wrap");
        return -0x6b80;
      }
    }
  }
  else {
    ssl->cur_out_ctr[0] = '\0';
    ssl->cur_out_ctr[1] = '\0';
    ssl->cur_out_ctr[2] = '\0';
    ssl->cur_out_ctr[3] = '\0';
    ssl->cur_out_ctr[4] = '\0';
    ssl->cur_out_ctr[5] = '\0';
    ssl->cur_out_ctr[6] = '\0';
    ssl->cur_out_ctr[7] = '\0';
  }
  ssl->transform_out = ssl->transform_negotiate;
  ssl->session_out = ssl->session_negotiate;
  if (ssl->conf->transport == '\x01') {
    mbedtls_ssl_send_flight_completed(ssl);
  }
  iVar5 = mbedtls_ssl_write_handshake_msg_ext(ssl,1,1);
  if (iVar5 == 0) {
    if ((ssl->conf->transport != '\x01') || (iVar5 = mbedtls_ssl_flight_transmit(ssl), iVar5 == 0))
    {
      mbedtls_debug_print_msg
                (ssl,2,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
                 ,0x1f13,"<= write finished");
      return 0;
    }
    text = "mbedtls_ssl_flight_transmit";
    line = 0x1f0e;
  }
  else {
    text = "mbedtls_ssl_write_handshake_msg";
    line = 0x1f07;
  }
  mbedtls_debug_print_ret
            (ssl,1,
             "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/mbedtls/repo/library/ssl_tls.c"
             ,line,text,iVar5);
  return iVar5;
}

Assistant:

int mbedtls_ssl_write_finished(mbedtls_ssl_context *ssl)
{
    int ret, hash_len;

    MBEDTLS_SSL_DEBUG_MSG(2, ("=> write finished"));

    mbedtls_ssl_update_out_pointers(ssl, ssl->transform_negotiate);

    ret = ssl->handshake->calc_finished(ssl, ssl->out_msg + 4, ssl->conf->endpoint);
    if (ret != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "calc_finished", ret);
    }

    /*
     * RFC 5246 7.4.9 (Page 63) says 12 is the default length and ciphersuites
     * may define some other value. Currently (early 2016), no defined
     * ciphersuite does this (and this is unlikely to change as activity has
     * moved to TLS 1.3 now) so we can keep the hardcoded 12 here.
     */
    hash_len = 12;

#if defined(MBEDTLS_SSL_RENEGOTIATION)
    ssl->verify_data_len = hash_len;
    memcpy(ssl->own_verify_data, ssl->out_msg + 4, hash_len);
#endif

    ssl->out_msglen  = 4 + hash_len;
    ssl->out_msgtype = MBEDTLS_SSL_MSG_HANDSHAKE;
    ssl->out_msg[0]  = MBEDTLS_SSL_HS_FINISHED;

    /*
     * In case of session resuming, invert the client and server
     * ChangeCipherSpec messages order.
     */
    if (ssl->handshake->resume != 0) {
#if defined(MBEDTLS_SSL_CLI_C)
        if (ssl->conf->endpoint == MBEDTLS_SSL_IS_CLIENT) {
            ssl->state = MBEDTLS_SSL_HANDSHAKE_WRAPUP;
        }
#endif
#if defined(MBEDTLS_SSL_SRV_C)
        if (ssl->conf->endpoint == MBEDTLS_SSL_IS_SERVER) {
            ssl->state = MBEDTLS_SSL_CLIENT_CHANGE_CIPHER_SPEC;
        }
#endif
    } else {
        ssl->state++;
    }

    /*
     * Switch to our negotiated transform and session parameters for outbound
     * data.
     */
    MBEDTLS_SSL_DEBUG_MSG(3, ("switching to new transform spec for outbound data"));

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if (ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM) {
        unsigned char i;

        /* Remember current epoch settings for resending */
        ssl->handshake->alt_transform_out = ssl->transform_out;
        memcpy(ssl->handshake->alt_out_ctr, ssl->cur_out_ctr,
               sizeof(ssl->handshake->alt_out_ctr));

        /* Set sequence_number to zero */
        memset(&ssl->cur_out_ctr[2], 0, sizeof(ssl->cur_out_ctr) - 2);


        /* Increment epoch */
        for (i = 2; i > 0; i--) {
            if (++ssl->cur_out_ctr[i - 1] != 0) {
                break;
            }
        }

        /* The loop goes to its end iff the counter is wrapping */
        if (i == 0) {
            MBEDTLS_SSL_DEBUG_MSG(1, ("DTLS epoch would wrap"));
            return MBEDTLS_ERR_SSL_COUNTER_WRAPPING;
        }
    } else
#endif /* MBEDTLS_SSL_PROTO_DTLS */
    memset(ssl->cur_out_ctr, 0, sizeof(ssl->cur_out_ctr));

    ssl->transform_out = ssl->transform_negotiate;
    ssl->session_out = ssl->session_negotiate;

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if (ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM) {
        mbedtls_ssl_send_flight_completed(ssl);
    }
#endif

    if ((ret = mbedtls_ssl_write_handshake_msg(ssl)) != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "mbedtls_ssl_write_handshake_msg", ret);
        return ret;
    }

#if defined(MBEDTLS_SSL_PROTO_DTLS)
    if (ssl->conf->transport == MBEDTLS_SSL_TRANSPORT_DATAGRAM &&
        (ret = mbedtls_ssl_flight_transmit(ssl)) != 0) {
        MBEDTLS_SSL_DEBUG_RET(1, "mbedtls_ssl_flight_transmit", ret);
        return ret;
    }
#endif

    MBEDTLS_SSL_DEBUG_MSG(2, ("<= write finished"));

    return 0;
}